

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_33c8f::ParseDummyNode::configureAttribute
          (ParseDummyNode *this,ConfigureContext *param_1,StringRef name,
          ArrayRef<llvm::StringRef> values)

{
  int iVar1;
  long lVar2;
  StringRef *this_00;
  char *pcVar3;
  iterator __begin3;
  StringRef local_60;
  string local_50;
  
  this_00 = values.Data;
  local_60.Length = name.Length;
  local_60.Data = name.Data;
  iVar1 = (*(this->delegate->super_BuildFileDelegate)._vptr_BuildFileDelegate[0xd])();
  if ((char)iVar1 != '\0') {
    llvm::StringRef::str_abi_cxx11_(&local_50,&local_60);
    printf("  -- \'%s\': [",local_50._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
    pcVar3 = "";
    for (lVar2 = values.Length << 4; lVar2 != 0; lVar2 = lVar2 + -0x10) {
      llvm::StringRef::str_abi_cxx11_(&local_50,this_00);
      printf("%s\'%s\'",pcVar3,local_50._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
      this_00 = this_00 + 1;
      pcVar3 = ", ";
    }
    puts("]");
  }
  return true;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext&, StringRef name,
                                  ArrayRef<StringRef> values) override {
    if (delegate.shouldShowOutput()) {
      printf("  -- '%s': [", name.str().c_str());
      bool first = true;
      for (const auto& value: values) {
        printf("%s'%s'", first ? "" : ", ", value.str().c_str());
        first = false;
      }
      printf("]\n");
    }
    return true;
  }